

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O2

uint64_t qDecodeBitfield(QMyField *f,char *outField)

{
  uint64_t uVar1;
  unsigned_long i;
  ulong uVar2;
  
  uVar1 = 0;
  for (uVar2 = 0; (outField != (char *)0x0 && (uVar2 < f->myField->length + 7 >> 3));
      uVar2 = uVar2 + 1) {
    uVar1 = uVar1 << 8 | (ulong)(byte)outField[uVar2];
  }
  return uVar1;
}

Assistant:

static inline uint64_t
qDecodeBitfield(const QMYSQLResultPrivate::QMyField &f, const char *outField)
{
    // byte-aligned length
    const auto numBytes = (f.myField->length + 7) / 8;
    uint64_t val = 0;
    for (unsigned long i = 0; i < numBytes && outField; ++i) {
        uint64_t tmp = static_cast<uint8_t>(outField[i]);
        val <<= 8;
        val |= tmp;
    }
    return val;
}